

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

IHEVCD_ERROR_T
ihevcd_short_term_ref_pic_set
          (bitstrm_t *ps_bitstrm,stref_picset_t *ps_stref_picset_base,
          WORD32 num_short_term_ref_pic_sets,WORD32 idx,stref_picset_t *ps_stref_picset)

{
  undefined1 uVar1;
  short sVar2;
  short sVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  UWORD32 UVar7;
  UWORD32 UVar8;
  long lVar9;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  bitstrm_t *in_RDI;
  long in_R8;
  WORD32 poc;
  WORD32 prev_poc;
  WORD8 i1_used_1;
  WORD32 delta_poc_2;
  WORD8 i1_used;
  WORD32 delta_poc_1;
  WORD32 delta_poc;
  WORD32 ref_idc;
  WORD32 num_pics;
  WORD32 num_pos_pics;
  WORD32 num_neg_pics;
  WORD32 abs_delta_rps;
  WORD32 delta_rps_sign;
  WORD32 temp;
  WORD32 k;
  WORD32 j;
  WORD32 i;
  WORD32 r_idx;
  WORD32 delta_rps;
  WORD32 delta_idx;
  stref_picset_t *ps_stref_picset_ref;
  WORD32 value;
  IHEVCD_ERROR_T ret;
  char local_a8;
  int local_a4;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_7c;
  UWORD32 local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_48;
  int local_44;
  int local_40;
  int local_34;
  
  if (in_ECX < 1) {
    *(undefined1 *)(in_R8 + 0x20) = 0;
  }
  else {
    UVar7 = ihevcd_bits_get(in_RDI,1);
    *(char *)(in_R8 + 0x20) = (char)UVar7;
  }
  if (*(char *)(in_R8 + 0x20) == '\0') {
    local_7c = 0;
    UVar7 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    *(char *)(in_R8 + 0x21) = (char)UVar7;
    if (*(char *)(in_R8 + 0x21) < '\x10') {
      if (*(char *)(in_R8 + 0x21) < '\0') {
        local_a4 = 0;
      }
      else {
        local_a4 = (int)*(char *)(in_R8 + 0x21);
      }
    }
    else {
      local_a4 = 0xf;
    }
    *(char *)(in_R8 + 0x21) = (char)local_a4;
    UVar7 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffff64,local_a4));
    *(char *)(in_R8 + 0x22) = (char)UVar7;
    if (0xf - *(char *)(in_R8 + 0x21) < (int)*(char *)(in_R8 + 0x22)) {
      local_a8 = '\x0f' - *(char *)(in_R8 + 0x21);
    }
    else if (*(char *)(in_R8 + 0x22) < '\0') {
      local_a8 = '\0';
    }
    else {
      local_a8 = *(char *)(in_R8 + 0x22);
    }
    *(char *)(in_R8 + 0x22) = local_a8;
    *(char *)(in_R8 + 0x43) = *(char *)(in_R8 + 0x21) + *(char *)(in_R8 + 0x22);
    for (local_40 = 0; local_40 < *(char *)(in_R8 + 0x21); local_40 = local_40 + 1) {
      UVar7 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffff64,local_a4));
      local_7c = local_7c - (UVar7 + 1);
      *(short *)(in_R8 + (long)local_40 * 2) = (short)local_7c;
      UVar7 = ihevcd_bits_get(in_RDI,1);
      *(char *)(in_R8 + 0x23 + (long)local_40) = (char)UVar7;
    }
    local_7c = 0;
    for (local_40 = (int)*(char *)(in_R8 + 0x21); local_40 < *(char *)(in_R8 + 0x43);
        local_40 = local_40 + 1) {
      UVar7 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffff64,local_a4));
      local_7c = local_7c + UVar7 + 1;
      *(short *)(in_R8 + (long)local_40 * 2) = (short)local_7c;
      UVar7 = ihevcd_bits_get(in_RDI,1);
      *(char *)(in_R8 + 0x23 + (long)local_40) = (char)UVar7;
    }
  }
  else {
    local_58 = 0;
    local_5c = 0;
    local_60 = 0;
    if (in_ECX == in_EDX) {
      UVar7 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
      ;
      local_34 = UVar7 + 1;
    }
    else {
      local_34 = 1;
    }
    local_88 = in_ECX - local_34;
    if (in_ECX + -1 < local_88) {
      local_84 = in_ECX + -1;
    }
    else {
      if (local_88 < 0) {
        local_88 = 0;
      }
      local_84 = local_88;
    }
    lVar9 = in_RSI + (long)local_84 * 0x46;
    UVar7 = ihevcd_bits_get(in_RDI,1);
    UVar8 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    for (local_40 = 0; local_40 <= *(char *)(lVar9 + 0x43); local_40 = local_40 + 1) {
      local_64 = ihevcd_bits_get(in_RDI,1);
      *(char *)(in_R8 + 0x23 + (long)local_60) = (char)local_64;
      if (local_64 == 0) {
        local_64 = ihevcd_bits_get(in_RDI,1);
        local_64 = local_64 << 1;
      }
      if ((local_64 == 1) || (local_64 == 2)) {
        if (local_40 < *(char *)(lVar9 + 0x43)) {
          local_8c = (int)*(short *)(lVar9 + (long)local_40 * 2);
        }
        else {
          local_8c = 0;
        }
        local_8c = local_8c + (UVar7 * -2 + 1) * (UVar8 + 1);
        *(short *)(in_R8 + (long)local_60 * 2) = (short)local_8c;
        if (local_8c < 0) {
          local_58 = local_58 + 1;
        }
        else {
          local_5c = local_5c + 1;
        }
        local_60 = local_60 + 1;
      }
      *(char *)(in_R8 + 0x33 + (long)local_40) = (char)local_64;
    }
    if (local_58 < 0x10) {
      if (local_58 < 0) {
        local_94 = 0;
      }
      else {
        local_94 = local_58;
      }
      local_90 = local_94;
    }
    else {
      local_90 = 0xf;
    }
    if (0xf - local_90 < local_5c) {
      local_98 = 0xf - local_90;
    }
    else {
      local_98 = local_5c;
      if (local_5c < 0) {
        local_98 = 0;
      }
    }
    *(char *)(in_R8 + 0x44) = *(char *)(lVar9 + 0x43) + '\x01';
    *(char *)(in_R8 + 0x43) = (char)(local_90 + local_98);
    *(char *)(in_R8 + 0x22) = (char)local_98;
    *(char *)(in_R8 + 0x21) = (char)local_90;
    for (local_44 = 1; local_44 < local_90 + local_98; local_44 = local_44 + 1) {
      sVar2 = *(short *)(in_R8 + (long)local_44 * 2);
      uVar1 = *(undefined1 *)(in_R8 + 0x23 + (long)local_44);
      iVar6 = local_44;
      while (iVar5 = iVar6, local_48 = iVar5 + -1, -1 < local_48) {
        sVar3 = *(short *)(in_R8 + (long)local_48 * 2);
        iVar6 = local_48;
        if (sVar2 < sVar3) {
          *(short *)(in_R8 + (long)iVar5 * 2) = sVar3;
          *(undefined1 *)(in_R8 + 0x23 + (long)iVar5) =
               *(undefined1 *)(in_R8 + 0x23 + (long)local_48);
          *(short *)(in_R8 + (long)local_48 * 2) = sVar2;
          *(undefined1 *)(in_R8 + 0x23 + (long)local_48) = uVar1;
          iVar6 = local_48;
        }
      }
    }
    local_48 = local_90;
    for (local_44 = 0; local_48 = local_48 + -1, local_44 < local_90 >> 1; local_44 = local_44 + 1)
    {
      uVar4 = *(undefined2 *)(in_R8 + (long)local_44 * 2);
      uVar1 = *(undefined1 *)(in_R8 + 0x23 + (long)local_44);
      *(undefined2 *)(in_R8 + (long)local_44 * 2) = *(undefined2 *)(in_R8 + (long)local_48 * 2);
      *(undefined1 *)(in_R8 + 0x23 + (long)local_44) =
           *(undefined1 *)(in_R8 + 0x23 + (long)local_48);
      *(undefined2 *)(in_R8 + (long)local_48 * 2) = uVar4;
      *(undefined1 *)(in_R8 + 0x23 + (long)local_48) = uVar1;
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_short_term_ref_pic_set(bitstrm_t *ps_bitstrm,
                                             stref_picset_t *ps_stref_picset_base,
                                             WORD32 num_short_term_ref_pic_sets,
                                             WORD32 idx,
                                             stref_picset_t *ps_stref_picset)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    stref_picset_t *ps_stref_picset_ref;
    WORD32 delta_idx, delta_rps;
    WORD32 r_idx;
    WORD32 i;
    WORD32 j, k, temp;
    if(idx > 0)
    {
        BITS_PARSE("inter_ref_pic_set_prediction_flag", value, ps_bitstrm, 1);
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = value;
    }
    else
        ps_stref_picset->i1_inter_ref_pic_set_prediction_flag = 0;

    if(ps_stref_picset->i1_inter_ref_pic_set_prediction_flag)
    {
        WORD32 delta_rps_sign;
        WORD32 abs_delta_rps;
        WORD32 num_neg_pics = 0;
        WORD32 num_pos_pics = 0;
        WORD32 num_pics = 0;

        if(idx == num_short_term_ref_pic_sets)
        {
            UEV_PARSE("delta_idx_minus1", value, ps_bitstrm);
            delta_idx = value + 1;
        }
        else
        {
            delta_idx = 1;
        }
        r_idx = idx - delta_idx;
        r_idx = CLIP3(r_idx, 0, idx - 1);

        ps_stref_picset_ref = ps_stref_picset_base + r_idx;

        BITS_PARSE("delta_rps_sign", value, ps_bitstrm, 1);
        delta_rps_sign = value;

        UEV_PARSE("abs_delta_rps_minus1", value, ps_bitstrm);
        abs_delta_rps = value + 1;

        delta_rps = (1 - 2 * delta_rps_sign) * (abs_delta_rps);



        for(i = 0; i <= ps_stref_picset_ref->i1_num_delta_pocs; i++)
        {
            WORD32 ref_idc;

            /*****************************************************************/
            /* ref_idc is parsed as below                                    */
            /* bits "1" ref_idc 1                                            */
            /* bits "01" ref_idc 2                                           */
            /* bits "00" ref_idc 0                                           */
            /*****************************************************************/
            BITS_PARSE("used_by_curr_pic_flag", value, ps_bitstrm, 1);
            ref_idc = value;
            ps_stref_picset->ai1_used[num_pics] = value;
            /* If ref_idc is zero check for next bit */
            if(0 == ref_idc)
            {
                BITS_PARSE("use_delta_flag", value, ps_bitstrm, 1);
                ref_idc = value << 1;
            }
            if((ref_idc == 1) || (ref_idc == 2))
            {
                WORD32 delta_poc;
                delta_poc = delta_rps;
                delta_poc +=
                                ((i < ps_stref_picset_ref->i1_num_delta_pocs) ?
                                ps_stref_picset_ref->ai2_delta_poc[i] :
                                0);

                ps_stref_picset->ai2_delta_poc[num_pics] = delta_poc;

                if(delta_poc < 0)
                {
                    num_neg_pics++;
                }
                else
                {
                    num_pos_pics++;
                }
                num_pics++;
            }
            ps_stref_picset->ai1_ref_idc[i] = ref_idc;
        }

        num_neg_pics = CLIP3(num_neg_pics, 0, MAX_DPB_SIZE - 1);
        num_pos_pics = CLIP3(num_pos_pics, 0, (MAX_DPB_SIZE - 1 - num_neg_pics));
        num_pics = num_neg_pics + num_pos_pics;

        ps_stref_picset->i1_num_ref_idc =
                        ps_stref_picset_ref->i1_num_delta_pocs + 1;
        ps_stref_picset->i1_num_delta_pocs = num_pics;
        ps_stref_picset->i1_num_pos_pics = num_pos_pics;
        ps_stref_picset->i1_num_neg_pics = num_neg_pics;


        for(j = 1; j < num_pics; j++)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            for(k = j - 1; k >= 0; k--)
            {
                temp = ps_stref_picset->ai2_delta_poc[k];
                if(delta_poc < temp)
                {
                    ps_stref_picset->ai2_delta_poc[k + 1] = temp;
                    ps_stref_picset->ai1_used[k + 1] = ps_stref_picset->ai1_used[k];
                    ps_stref_picset->ai2_delta_poc[k] = delta_poc;
                    ps_stref_picset->ai1_used[k] = i1_used;
                }
            }
        }
        // flip the negative values to largest first
        for(j = 0, k = num_neg_pics - 1; j < num_neg_pics >> 1; j++, k--)
        {
            WORD32 delta_poc = ps_stref_picset->ai2_delta_poc[j];
            WORD8 i1_used = ps_stref_picset->ai1_used[j];
            ps_stref_picset->ai2_delta_poc[j] = ps_stref_picset->ai2_delta_poc[k];
            ps_stref_picset->ai1_used[j] = ps_stref_picset->ai1_used[k];
            ps_stref_picset->ai2_delta_poc[k] = delta_poc;
            ps_stref_picset->ai1_used[k] = i1_used;
        }

    }
    else
    {
        WORD32 prev_poc = 0;
        WORD32 poc;

        UEV_PARSE("num_negative_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_neg_pics = value;
        ps_stref_picset->i1_num_neg_pics = CLIP3(ps_stref_picset->i1_num_neg_pics,
                                                 0,
                                                 MAX_DPB_SIZE - 1);

        UEV_PARSE("num_positive_pics", value, ps_bitstrm);
        ps_stref_picset->i1_num_pos_pics = value;
        ps_stref_picset->i1_num_pos_pics = CLIP3(ps_stref_picset->i1_num_pos_pics,
                                                 0,
                                                 (MAX_DPB_SIZE - 1 - ps_stref_picset->i1_num_neg_pics));

        ps_stref_picset->i1_num_delta_pocs =
                        ps_stref_picset->i1_num_neg_pics +
                        ps_stref_picset->i1_num_pos_pics;


        for(i = 0; i < ps_stref_picset->i1_num_neg_pics; i++)
        {
            UEV_PARSE("delta_poc_s0_minus1", value, ps_bitstrm);
            poc = prev_poc - (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s0_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }
        prev_poc = 0;
        for(i = ps_stref_picset->i1_num_neg_pics;
                        i < ps_stref_picset->i1_num_delta_pocs;
                        i++)
        {
            UEV_PARSE("delta_poc_s1_minus1", value, ps_bitstrm);
            poc = prev_poc + (value + 1);
            prev_poc = poc;
            ps_stref_picset->ai2_delta_poc[i] = poc;

            BITS_PARSE("used_by_curr_pic_s1_flag", value, ps_bitstrm, 1);
            ps_stref_picset->ai1_used[i] = value;

        }

    }

    return ret;
}